

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunMemoryToRegister(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint uVar1;
  ScopeData *pSVar2;
  VariableData *container;
  TypeBase *pTVar3;
  VmConstant *pVVar4;
  VmBlock *pVVar5;
  VmBlock *pVVar6;
  SynIdentifier *pSVar7;
  VmInstruction *this;
  VmValue *this_00;
  VmValueType VVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ArrayView<VmInstruction_*> phiNodes_00;
  bool bVar12;
  VmValueType VVar13;
  VmValueType VVar14;
  VmBlock *pVVar15;
  VmInstruction *pVVar16;
  int iVar17;
  VariableHandle *pVVar18;
  ulong uVar19;
  char *pcVar20;
  VmValueType VVar21;
  uint newSize;
  ulong uVar22;
  ulong uVar23;
  VmValue *pVVar24;
  ulong uVar25;
  SmallArray<VmValue_*,_4U> *this_01;
  VmType VVar26;
  VmType type;
  SmallArray<VmBlock_*,_32U> worklist;
  SmallArray<VmInstruction_*,_32U> phiNodes;
  SmallArray<VmInstruction_*,_32U> unusedPhiNodes;
  SmallArray<VmValue_*,_32U> stack;
  VmValue *in_stack_fffffffffffffb08;
  VmValueType local_4b8;
  undefined4 uStack_494;
  SmallArray<VmBlock_*,_32U> local_490;
  SmallArray<VmInstruction_*,_32U> local_378;
  SmallArray<VmInstruction_*,_32U> local_260;
  SmallArray<VmValue_*,_32U> local_148;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 4)) {
    value = (VmValue *)0x0;
  }
  if ((((VmFunction *)value != (VmFunction *)0x0) &&
      (((VmFunction *)value)->firstBlock != (VmBlock *)0x0)) &&
     (((VmFunction *)value)->function != (FunctionData *)0x0)) {
    VmFunction::UpdateDominatorTree((VmFunction *)value,module,true);
    pSVar2 = ((VmFunction *)value)->scope;
    if ((pSVar2 != (ScopeData *)0x0) && (pSVar2 != ctx->globalScope)) {
      for (pVVar15 = ((VmFunction *)value)->firstBlock; pVVar15 != (VmBlock *)0x0;
          pVVar15 = pVVar15->nextSibling) {
        pVVar15->hasAssignmentForId = 0;
        pVVar15->hasPhiNodeForId = 0;
      }
      if ((pSVar2->allVariables).count != 0) {
        uVar19 = 0;
        do {
          container = (pSVar2->allVariables).data[uVar19];
          if ((container->isAlloca != true) || ((container->users).count != 0)) {
            bVar12 = IsMemberScope(container->scope);
            if (bVar12) {
              __assert_fail("!IsMemberScope(variable->scope)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x17c0,
                            "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
            }
            bVar12 = IsGlobalScope(container->scope);
            if (bVar12) {
              __assert_fail("!IsGlobalScope(variable->scope)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x17c1,
                            "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)");
            }
            bVar12 = HasAddressTaken(container);
            if (!bVar12) {
              VVar26 = GetVmType(ctx,container->type);
              pTVar3 = container->type;
              if (((pTVar3 == ctx->typeInt) || (pTVar3 == ctx->typeDouble)) ||
                 (local_4b8 = VVar26.type, pTVar3 == ctx->typeLong || local_4b8 == VM_TYPE_POINTER))
              {
                local_490.allocator = module->allocator;
                local_490.data = local_490.little;
                local_490.count = 0;
                local_490.max = 0x20;
                pVVar18 = (((VmFunction *)value)->function->argumentVariables).head;
                while( true ) {
                  iVar17 = (int)uVar19;
                  if (pVVar18 == (VariableHandle *)0x0) break;
                  if (pVVar18->variable == container) {
                    if (pVVar18 != (VariableHandle *)0x0) goto LAB_001ba790;
                    break;
                  }
                  pVVar18 = pVVar18->next;
                }
                if (((VmFunction *)value)->function->contextArgument == container) {
LAB_001ba790:
                  ((VmFunction *)value)->firstBlock->hasAssignmentForId = iVar17 + 1;
                  if (local_490.data == (VmBlock **)0x0) {
LAB_001baf58:
                    pcVar20 = 
                    "void SmallArray<VmBlock *, 32>::push_back(const T &) [T = VmBlock *, N = 32]";
                    goto LAB_001baef9;
                  }
                  local_490.count = 1;
                  local_490.max = 0x20;
                  local_490.little[0] = ((VmFunction *)value)->firstBlock;
                }
                if ((container->users).count != 0) {
                  uVar25 = 0;
                  do {
                    pVVar4 = (container->users).data[uVar25];
                    if ((pVVar4->super_VmValue).users.count != 0) {
                      uVar23 = 0;
                      do {
                        pVVar24 = (pVVar4->super_VmValue).users.data[uVar23];
                        if ((pVVar24 == (VmValue *)0x0) || (pVVar24->typeID != 2)) {
                          pVVar24 = (VmValue *)0x0;
                        }
                        if ((pVVar24 != (VmValue *)0x0) &&
                           (*(int *)&pVVar24[1]._vptr_VmValue - 8U < 7)) {
                          if (pVVar24[1].type.type == VM_TYPE_VOID) {
LAB_001baeae:
                            pcVar20 = 
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                            ;
LAB_001baeda:
                            __assert_fail("index < count",
                                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                          ,0x199,pcVar20);
                          }
                          if ((VmConstant *)**(undefined8 **)&pVVar24[1].typeID == pVVar4) {
                            if ((local_490._8_8_ & 0xffffffff) != 0) {
                              uVar22 = 1;
                              bVar12 = false;
                              do {
                                if (local_490.data[uVar22 - 1] == (VmBlock *)pVVar24[1].users.data)
                                {
                                  bVar12 = true;
                                }
                              } while ((uVar22 < (local_490._8_8_ & 0xffffffff)) &&
                                      (uVar22 = uVar22 + 1, !bVar12));
                              if (bVar12) goto LAB_001ba8e8;
                            }
                            *(int *)(pVVar24[1].users.data + 0x3d) = iVar17 + 1;
                            if (local_490.count == local_490.max) {
                              SmallArray<VmBlock_*,_32U>::grow(&local_490,local_490.count);
                            }
                            if (local_490.data == (VmBlock **)0x0) goto LAB_001baf58;
                            uVar22 = local_490._8_8_ & 0xffffffff;
                            local_490.count = local_490.count + 1;
                            local_490.data[uVar22] = (VmBlock *)pVVar24[1].users.data;
                          }
                        }
LAB_001ba8e8:
                        uVar23 = uVar23 + 1;
                      } while (uVar23 < (pVVar4->super_VmValue).users.count);
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (container->users).count);
                }
                module->currentFunction = (VmFunction *)value;
                local_378.allocator = module->allocator;
                local_378.data = local_378.little;
                local_378.count = 0;
                local_378.max = 0x20;
                if (local_490.count != 0) {
                  do {
                    pVVar15 = local_490.data[local_490.count - 1];
                    local_490.count = local_490.count - 1;
                    if ((pVVar15->dominanceFrontier).count != 0) {
                      uVar25 = 0;
                      do {
                        pVVar5 = (pVVar15->dominanceFrontier).data[uVar25];
                        if (pVVar5->hasPhiNodeForId <= uVar19) {
                          module->currentBlock = pVVar5;
                          pVVar5->insertPoint = (VmInstruction *)0x0;
                          type.structType = (TypeBase *)0x4d;
                          type._0_8_ = VVar26.structType;
                          pVVar16 = anon_unknown.dwarf_13465d::CreateInstruction
                                              ((anon_unknown_dwarf_13465d *)module,(VmModule *)0x0,
                                               VVar26._0_8_,type,VM_INST_LOAD_BYTE,(VmValue *)0x0,
                                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                                               in_stack_fffffffffffffb08);
                          if ((pVVar5->predecessors).count != 0) {
                            this_01 = &pVVar16->arguments;
                            uVar23 = 0;
                            do {
                              uVar1 = (pVVar16->arguments).count;
                              if (uVar1 == (pVVar16->arguments).max) {
                                SmallArray<VmValue_*,_4U>::grow(this_01,uVar1);
                              }
                              if (this_01->data == (VmValue **)0x0) {
LAB_001baee4:
                                pcVar20 = 
                                "void SmallArray<VmValue *, 4>::push_back(const T &) [T = VmValue *, N = 4]"
                                ;
                                goto LAB_001baef9;
                              }
                              uVar1 = (pVVar16->arguments).count;
                              newSize = uVar1 + 1;
                              (pVVar16->arguments).count = newSize;
                              this_01->data[uVar1] = (VmValue *)0x0;
                              if ((pVVar5->predecessors).count <= uVar23) {
LAB_001baec5:
                                pcVar20 = 
                                "T &SmallArray<VmBlock *, 4>::operator[](unsigned int) [T = VmBlock *, N = 4]"
                                ;
                                goto LAB_001baeda;
                              }
                              pVVar6 = (pVVar5->predecessors).data[uVar23];
                              if (newSize == (pVVar16->arguments).max) {
                                SmallArray<VmValue_*,_4U>::grow(this_01,newSize);
                              }
                              if (this_01->data == (VmValue **)0x0) goto LAB_001baee4;
                              uVar1 = (pVVar16->arguments).count;
                              (pVVar16->arguments).count = uVar1 + 1;
                              this_01->data[uVar1] = &pVVar6->super_VmValue;
                              if ((pVVar5->predecessors).count <= uVar23) goto LAB_001baec5;
                              VmValue::AddUse(&(pVVar5->predecessors).data[uVar23]->super_VmValue,
                                              &pVVar16->super_VmValue);
                              uVar23 = uVar23 + 1;
                            } while (uVar23 < (pVVar5->predecessors).count);
                          }
                          pSVar7 = container->name;
                          uVar9 = *(undefined4 *)((long)&(pSVar7->name).begin + 4);
                          uVar10 = *(undefined4 *)&(pSVar7->name).end;
                          uVar11 = *(undefined4 *)((long)&(pSVar7->name).end + 4);
                          *(undefined4 *)&(pVVar16->super_VmValue).comment.begin =
                               *(undefined4 *)&(pSVar7->name).begin;
                          *(undefined4 *)((long)&(pVVar16->super_VmValue).comment.begin + 4) = uVar9
                          ;
                          *(undefined4 *)&(pVVar16->super_VmValue).comment.end = uVar10;
                          *(undefined4 *)((long)&(pVVar16->super_VmValue).comment.end + 4) = uVar11;
                          if (local_378.count == local_378.max) {
                            SmallArray<VmInstruction_*,_32U>::grow(&local_378,local_378.count);
                          }
                          if (local_378.data == (VmInstruction **)0x0) goto LAB_001baf41;
                          uVar23 = local_378._8_8_ & 0xffffffff;
                          local_378.count = local_378.count + 1;
                          local_378.data[uVar23] = pVVar16;
                          pVVar5->insertPoint = pVVar5->lastInstruction;
                          module->currentBlock = (VmBlock *)0x0;
                          pVVar5->hasPhiNodeForId = iVar17 + 1U;
                          if (pVVar5->hasAssignmentForId <= uVar19) {
                            pVVar5->hasAssignmentForId = iVar17 + 1U;
                            if (local_490.count == local_490.max) {
                              SmallArray<VmBlock_*,_32U>::grow(&local_490,local_490.count);
                            }
                            if (local_490.data == (VmBlock **)0x0) goto LAB_001baf58;
                            uVar23 = local_490._8_8_ & 0xffffffff;
                            local_490.count = local_490.count + 1;
                            local_490.data[uVar23] = pVVar5;
                          }
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar25 < (pVVar15->dominanceFrontier).count);
                    }
                  } while (local_490.count != 0);
                }
                local_148.allocator = module->allocator;
                local_148.data = local_148.little;
                local_148.count = 0;
                local_148.max = 0x20;
                phiNodes_00._12_4_ = uStack_494;
                phiNodes_00.count = local_378.count;
                phiNodes_00.data = local_378.data;
                RenameMemoryToRegister
                          (ctx,module,((VmFunction *)value)->firstBlock,&local_148,container,
                           phiNodes_00);
                local_260.allocator = module->allocator;
                local_260.data = local_260.little;
                local_260.count = 0;
                local_260.max = 0x20;
                if (local_378.count != 0) {
                  uVar25 = 0;
                  do {
                    pVVar16 = local_378.data[uVar25];
                    uVar1 = ((VmFunction *)value)->nextSearchMarker;
                    ((VmFunction *)value)->nextSearchMarker = uVar1 + 1;
                    bVar12 = IsPhiUsed(pVVar16,uVar1);
                    if (!bVar12) {
                      if (local_260.count == local_260.max) {
                        SmallArray<VmInstruction_*,_32U>::grow(&local_260,local_260.count);
                      }
                      if (local_260.data == (VmInstruction **)0x0) goto LAB_001baf41;
                      uVar23 = local_260._8_8_ & 0xffffffff;
                      local_260.count = local_260.count + 1;
                      local_260.data[uVar23] = pVVar16;
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (local_378._8_8_ & 0xffffffff));
                }
                if (local_260.count != 0) {
                  uVar25 = 0;
                  do {
                    pVVar16 = local_260.data[uVar25];
                    (pVVar16->super_VmValue).canBeRemoved = false;
                    while (uVar1 = (pVVar16->super_VmValue).users.count, uVar1 != 0) {
                      pVVar24 = (pVVar16->super_VmValue).users.data[uVar1 - 1];
                      if ((pVVar24 == (VmValue *)0x0) || (pVVar24->typeID != 2)) {
                        pVVar24 = (VmValue *)0x0;
                      }
                      if (*(int *)&pVVar24[1]._vptr_VmValue != 0x4d) {
                        __assert_fail("user->cmd == VM_INST_PHI",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                      ,0x183e,
                                      "void RunMemoryToRegister(ExpressionContext &, VmModule *, VmValue *)"
                                     );
                      }
                      VVar13 = pVVar24[1].type.type;
                      if (VVar13 != VM_TYPE_VOID) {
                        uVar23 = 0;
                        do {
                          VVar8 = (VmValueType)uVar23;
                          VVar21 = VVar8 + VM_TYPE_INT;
                          if (VVar13 <= VVar21) goto LAB_001baeae;
                          this = *(VmInstruction **)(*(long *)&pVVar24[1].typeID + uVar23 * 8);
                          if (this == pVVar16) {
                            this_00 = *(VmValue **)(*(long *)&pVVar24[1].typeID + (ulong)VVar21 * 8)
                            ;
                            VmValue::RemoveUse(&this->super_VmValue,pVVar24);
                            VmValue::RemoveUse(this_00,pVVar24);
                            VVar13 = pVVar24[1].type.type;
                            if ((VVar13 < VM_TYPE_DOUBLE) || (VVar13 <= VVar8)) goto LAB_001baeae;
                            *(undefined8 *)(*(long *)&pVVar24[1].typeID + uVar23 * 8) =
                                 *(undefined8 *)
                                  (*(long *)&pVVar24[1].typeID +
                                  (ulong)(VVar13 - VM_TYPE_DOUBLE) * 8);
                            if (VVar13 <= VVar21) goto LAB_001baeae;
                            VVar14 = VVar13 - VM_TYPE_INT;
                            *(undefined8 *)(*(long *)&pVVar24[1].typeID + (ulong)VVar21 * 8) =
                                 *(undefined8 *)(*(long *)&pVVar24[1].typeID + (ulong)VVar14 * 8);
                            pVVar24[1].type.type = VVar14;
                            if (VVar14 == VM_TYPE_VOID) {
                              __assert_fail("count > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                            ,0x183,
                                            "void SmallArray<VmValue *, 4>::pop_back() [T = VmValue *, N = 4]"
                                           );
                            }
                            pVVar24[1].type.type = VVar13 - VM_TYPE_DOUBLE;
                          }
                          uVar23 = (ulong)(VVar8 + VM_TYPE_DOUBLE);
                          VVar13 = pVVar24[1].type.type;
                        } while (VVar8 + VM_TYPE_DOUBLE < VVar13);
                      }
                    }
                    (pVVar16->super_VmValue).canBeRemoved = true;
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (local_260._8_8_ & 0xffffffff));
                }
                module->currentFunction = (VmFunction *)0x0;
                SmallArray<VmInstruction_*,_32U>::~SmallArray(&local_260);
                SmallArray<VmValue_*,_32U>::~SmallArray(&local_148);
                SmallArray<VmInstruction_*,_32U>::~SmallArray(&local_378);
                SmallArray<VmBlock_*,_32U>::~SmallArray(&local_490);
              }
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < (pSVar2->allVariables).count);
      }
      VmFunction::UpdateLiveSets((VmFunction *)value,module);
    }
  }
  return;
LAB_001baf41:
  pcVar20 = 
  "void SmallArray<VmInstruction *, 32>::push_back(const T &) [T = VmInstruction *, N = 32]";
LAB_001baef9:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar20);
}

Assistant:

void RunMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		// Skip prototypes
		if(!function->firstBlock)
			return;

		// Skip global code
		if(!function->function)
			return;

		// Prepare dominator frontier data
		function->UpdateDominatorTree(module, true);

		ScopeData *scope = function->scope;

		if(!scope)
			return;

		// Keep stores to globals
		if(scope == ctx.globalScope)
			return;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			curr->hasAssignmentForId = 0;
			curr->hasPhiNodeForId = 0;
		}

		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			assert(!IsMemberScope(variable->scope));
			assert(!IsGlobalScope(variable->scope));

			// Consider only the variables that don't have their address taken
			if(HasAddressTaken(variable))
				continue;

			// Consider only variables of simple types
			VmType vmType = GetVmType(ctx, variable->type);

			if(variable->type != ctx.typeInt && variable->type != ctx.typeDouble && variable->type != ctx.typeLong && vmType.type != VM_TYPE_POINTER)
				continue;

			// Initilize the worklist with a set of blocks that contain assignments to the variable
			SmallArray<VmBlock*, 32> worklist(module->allocator);

			// Argument is implicitly initialized in the entry block
			if(IsArgumentVariable(function->function, variable))
			{
				function->firstBlock->hasAssignmentForId = i + 1;
				worklist.push_back(function->firstBlock);
			}

			// Find all explicit assignments
			for(unsigned varUserPos = 0; varUserPos < variable->users.size(); varUserPos++)
			{
				VmConstant *user = variable->users[varUserPos];

				for(unsigned containerUserPos = 0; containerUserPos < user->users.size(); containerUserPos++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[containerUserPos]))
					{
						if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							bool found = false;

							for(unsigned worklistPos = 0; worklistPos < worklist.size() && !found; worklistPos++)
							{
								if(worklist[worklistPos] == inst->parent)
									found = true;
							}

							if(!found)
							{
								inst->parent->hasAssignmentForId = i + 1;
								worklist.push_back(inst->parent);
							}
						}
					}
				}
			}

			module->currentFunction = function;

			// Add placeholders for required phi nodes
			SmallArray<VmInstruction*, 32> phiNodes(module->allocator);

			while(!worklist.empty())
			{
				VmBlock *block = worklist.back();
				worklist.pop_back();

				for(unsigned dfPos = 0; dfPos < block->dominanceFrontier.size(); dfPos++)
				{
					VmBlock *dominator = block->dominanceFrontier[dfPos];

					if(dominator->hasPhiNodeForId < i + 1)
					{
						// Add phi for variable
						module->currentBlock = dominator;
						dominator->insertPoint = NULL;

						VmInstruction *placeholder = CreateInstruction(module, NULL, vmType, VM_INST_PHI);

						for(unsigned predecessorPos = 0; predecessorPos < dominator->predecessors.size(); predecessorPos++)
						{
							placeholder->arguments.push_back(NULL);
							placeholder->arguments.push_back(dominator->predecessors[predecessorPos]);

							dominator->predecessors[predecessorPos]->AddUse(placeholder);
						}

						placeholder->comment = variable->name->name;

						phiNodes.push_back(placeholder);

						dominator->insertPoint = dominator->lastInstruction;
						module->currentBlock = NULL;

						dominator->hasPhiNodeForId = i + 1;

						if(dominator->hasAssignmentForId < i + 1)
						{
							dominator->hasAssignmentForId = i + 1;
							worklist.push_back(dominator);
						}
					}
				}
			}

			SmallArray<VmValue*, 32> stack(module->allocator);

			RenameMemoryToRegister(ctx, module, function->firstBlock, stack, variable, phiNodes);

			// Remove dead phi instructions (prune ssa)
			SmallArray<VmInstruction*, 32> unusedPhiNodes(module->allocator);

			for(unsigned k = 0; k < phiNodes.size(); k++)
			{
				VmInstruction *phi = phiNodes[k];

				if(!IsPhiUsed(phi, function->nextSearchMarker++))
					unusedPhiNodes.push_back(phi);
			}

			for(unsigned k = 0; k < unusedPhiNodes.size(); k++)
			{
				VmInstruction *phi = unusedPhiNodes[k];

				phi->canBeRemoved = false;

				// Remove from all phi users (since this is an unused phi node, all remaining users are circular references from other phi nodes)
				while(!phi->users.empty())
				{
					VmInstruction *user = getType<VmInstruction>(phi->users.back());

					assert(user->cmd == VM_INST_PHI);

					for(unsigned argument = 0; argument < user->arguments.size(); argument += 2)
					{
						VmValue *option = user->arguments[argument];
						VmValue *edge = user->arguments[argument + 1];

						if(option == phi)
						{
							option->RemoveUse(user);
							edge->RemoveUse(user);

							user->arguments[argument] = user->arguments[user->arguments.size() - 2];
							user->arguments[argument + 1] = user->arguments[user->arguments.size() - 1];

							user->arguments.pop_back();
							user->arguments.pop_back();
						}
					}
				}

				phi->canBeRemoved = true;
			}

			module->currentFunction = NULL;
		}

		function->UpdateLiveSets(module);
	}
}